

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O2

int do_look(boolean quick)

{
  nh_menuitem *pnVar1;
  obj *poVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  ulong uVar10;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  undefined7 extraout_var;
  undefined8 extraout_RAX_03;
  boolean in_CL;
  boolean without_asking;
  long lVar11;
  nh_desc_buf *__src;
  char *pcVar12;
  char *new_str;
  uint uVar13;
  coord cc;
  menulist menu;
  int selected [1];
  char out_str [256];
  char firstmatch [256];
  nh_desc_buf descbuf;
  
  if (quick == '\0') {
    cVar4 = yn_function("Specify unknown object by cursor?","ynq",'q');
    if (cVar4 == 'q') {
      return (int)CONCAT71(extraout_var,cVar4);
    }
    if (cVar4 != 'y') {
      getlin("Specify what? (type the word)",out_str);
      if (out_str[0] == '\0') {
        return (uint)(byte)out_str[0];
      }
      if (out_str[0] == '\x1b') {
        return (uint)(byte)out_str[0];
      }
      checkfile(out_str,(permonst *)0x1,'\x01',in_CL);
      return extraout_EAX;
    }
  }
  bVar3 = flags.verbose;
  cc.x = u.ux;
  cc.y = u.uy;
  flags.verbose = flags.verbose != '\0' && quick == '\0';
  pcVar12 = descbuf.objdesc;
  do {
    out_str[0] = '\0';
    if (flags.verbose == '\0') {
      pline("Pick an object.");
    }
    else {
      pline("Please move the cursor to %s.");
    }
    iVar5 = getpos(&cc,'\0',"an unknown object");
    iVar8 = iVar5;
    if (iVar5 < 0) {
LAB_002013c6:
      if (bVar3 == '\0') {
        flags.verbose = bVar3;
        return CONCAT31((int3)((uint)iVar8 >> 8),bVar3);
      }
      pcVar12 = "Never mind.";
      if (quick == '\0') {
        pcVar12 = "Done.";
      }
      goto LAB_00201415;
    }
    iVar8 = CONCAT31((int3)((uint)iVar5 >> 8),cc.x);
    if (cc.x < '\0') goto LAB_002013c6;
    flags.verbose = '\0';
    nh_describe_pos((uint)(byte)cc.x,(int)cc.y,&descbuf);
    poVar2 = level->objects[cc.x][cc.y];
    uVar13 = 0;
    iVar8 = 0;
    if ((poVar2 != (obj *)0x0) && ((1 < poVar2->quan || (poVar2->oartifact == '\x1d')))) {
      iVar8 = 1;
    }
    init_menulist(&menu);
    out_str[0] = '\0';
    iVar6 = append_str(out_str,descbuf.effectdesc,0);
    if (iVar6 != 0) {
      lVar11 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0x65;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,descbuf.effectdesc);
      menu.icount = menu.icount + 1;
      strcpy(firstmatch,descbuf.effectdesc);
      uVar13 = 1;
    }
    iVar7 = append_str(out_str,descbuf.invisdesc,0);
    if (iVar7 != 0) {
      lVar11 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0x69;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,descbuf.invisdesc);
      menu.icount = menu.icount + 1;
      uVar13 = 2;
      if (iVar6 == 0) {
        strcpy(firstmatch,descbuf.invisdesc);
        uVar13 = 1;
      }
    }
    iVar6 = append_str(out_str,descbuf.mondesc,0);
    if (iVar6 != 0) {
      lVar11 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0x6d;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,descbuf.mondesc);
      menu.icount = menu.icount + 1;
      if (uVar13 == 0) {
        strcpy(firstmatch,descbuf.mondesc);
        uVar13 = 1;
      }
      else {
        uVar13 = uVar13 + 1;
      }
    }
    iVar8 = append_str(out_str,pcVar12,iVar8);
    if (iVar8 != 0) {
      lVar11 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0x6f;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pcVar12);
      menu.icount = menu.icount + 1;
      if (uVar13 == 0) {
        strcpy(firstmatch,pcVar12);
        uVar13 = 1;
      }
      else {
        uVar13 = uVar13 + 1;
      }
    }
    new_str = descbuf.trapdesc;
    iVar8 = append_str(out_str,new_str,0);
    if (iVar8 != 0) {
      lVar11 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0x74;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,new_str);
      menu.icount = menu.icount + 1;
      if (uVar13 == 0) {
        strcpy(firstmatch,new_str);
        uVar13 = 1;
      }
      else {
        uVar13 = uVar13 + 1;
      }
    }
    iVar8 = append_str(out_str,descbuf.bgdesc,0);
    if ((iVar8 == 0) || (uVar13 != 0)) {
      if (uVar13 != 0) goto LAB_00201237;
      pline("I\'ve never heard of such things.");
      uVar10 = extraout_RAX_00;
    }
    else {
      lVar11 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0x62;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,descbuf.bgdesc);
      menu.icount = menu.icount + 1;
      strcpy(firstmatch,descbuf.bgdesc);
      uVar13 = 1;
LAB_00201237:
      out_str[0] = highc(out_str[0]);
      pline("%s.");
      without_asking = (boolean)(iVar5 - 1U);
      uVar10 = CONCAT71((int7)((ulong)extraout_RAX >> 8),iVar5 != 3);
      if ((1 < iVar5 - 1U) && (quick == '\0' || iVar5 == 3)) {
        if (1 < uVar13) {
          without_asking = '\x01';
          uVar9 = display_menu(menu.items,menu.icount,"More info?",1,selected);
          uVar10 = (ulong)uVar9;
          if (uVar9 != 1) goto LAB_00201337;
          if (selected[0] == 0x62) {
            __src = &descbuf;
          }
          else {
            __src = (nh_desc_buf *)descbuf.effectdesc;
            if ((((selected[0] != 0x65) && (__src = (nh_desc_buf *)new_str, selected[0] != 0x74)) &&
                (__src = (nh_desc_buf *)descbuf.mondesc, selected[0] != 0x6d)) &&
               ((__src = (nh_desc_buf *)pcVar12, selected[0] != 0x6f &&
                (__src = (nh_desc_buf *)descbuf.invisdesc, selected[0] != 0x69))))
            goto LAB_00201313;
          }
          strcpy(firstmatch,__src->bgdesc);
        }
LAB_00201313:
        checkfile(firstmatch,(permonst *)(ulong)(1 < uVar13),iVar5 == 3 || 1 < uVar13,without_asking
                 );
        uVar10 = extraout_RAX_01;
      }
    }
LAB_00201337:
    if (menu.icount != 0) {
      free(menu.items);
      uVar10 = extraout_RAX_02;
    }
    if (quick != '\0') {
      check_tutorial_farlook((int)cc.x,(int)cc.y);
      flags.verbose = bVar3;
      return (int)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),bVar3);
    }
  } while (iVar5 != 2);
  iVar8 = (int)CONCAT71((int7)(uVar10 >> 8),bVar3);
  flags.verbose = bVar3;
  if (bVar3 != '\0') {
    pcVar12 = "Done.";
LAB_00201415:
    flags.verbose = bVar3;
    pline(pcVar12);
    iVar8 = extraout_EAX_00;
  }
  return iVar8;
}

Assistant:

static int do_look(boolean quick)
{
    char out_str[BUFSZ];
    char firstmatch[BUFSZ];
    int i, ans = 0, objplur = 0;
    int found;		/* count of matching syms found */
    coord cc;		/* screen pos of unknown glyph */
    boolean save_verbose;	/* saved value of flags.verbose */
    boolean from_screen;	/* question from the screen */
    struct nh_desc_buf descbuf;
    struct obj *otmp;
    struct menulist menu;
    int n, selected[1];

    if (quick) {
	from_screen = TRUE;	/* yes, we want to use the cursor */
    } else {
	i = ynq("Specify unknown object by cursor?");
	if (i == 'q') return 0;
	from_screen = (i == 'y');
    }

    if (from_screen) {
	cc.x = u.ux;
	cc.y = u.uy;
    } else {
	getlin("Specify what? (type the word)", out_str);
	if (out_str[0] == '\0' || out_str[0] == '\033')
	    return 0;

	/* the ability to specify symbols is gone: it is simply impossible to
	 * know how the window port is displaying things (tiles?) and even if
	 * charaters are used it may not be possible to type them (utf8)
	 */
	
	checkfile(out_str, NULL, TRUE, TRUE);
	return 0;
    }
    /* Save the verbose flag, we change it later. */
    save_verbose = flags.verbose;
    flags.verbose = flags.verbose && !quick;
    
    /*
     * we're identifying from the screen.
     */
    do {
	/* Reset some variables. */
	found = 0;
	out_str[0] = '\0';
	objplur = 0;

	if (flags.verbose)
	    pline("Please move the cursor to %s.",
		    what_is_an_unknown_object);
	else
	    pline("Pick an object.");

	ans = getpos(&cc, FALSE, what_is_an_unknown_object);
	if (ans < 0 || cc.x < 0) {
	    flags.verbose = save_verbose;
	    if (flags.verbose)
		pline(quick ? "Never mind." : "Done.");
	    return 0;	/* done */
	}
	flags.verbose = FALSE;	/* only print long question once */

	nh_describe_pos(cc.x, cc.y, &descbuf);
	
	otmp = vobj_at(cc.x, cc.y);
	if (otmp && is_plural(otmp))
	    objplur = 1;

	init_menulist(&menu);
	out_str[0] = '\0';
	if (append_str(out_str, descbuf.effectdesc, 0)) {
	    add_menuitem(&menu, 'e', descbuf.effectdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.effectdesc);
	}
	if (append_str(out_str, descbuf.invisdesc, 0)) {
	    add_menuitem(&menu, 'i', descbuf.invisdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.invisdesc);
	}
	if (append_str(out_str, descbuf.mondesc, 0)) {
	    add_menuitem(&menu, 'm', descbuf.mondesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.mondesc);
	}
	if (append_str(out_str, descbuf.objdesc, objplur)) {
	    add_menuitem(&menu, 'o', descbuf.objdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.objdesc);
	}
	if (append_str(out_str, descbuf.trapdesc, 0)) {
	    add_menuitem(&menu, 't', descbuf.trapdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.trapdesc);
	}
	if (append_str(out_str, descbuf.bgdesc, 0)) {
	    if (!found) {
		add_menuitem(&menu, 'b', descbuf.bgdesc, 0, FALSE);
		found++; /* only increment found if nothing else was seen,
		so that checkfile can be called below */
		strcpy (firstmatch, descbuf.bgdesc);
	    }
	}

	/* Finally, print out our explanation. */
	if (found) {
	    out_str[0] = highc(out_str[0]);
	    pline("%s.", out_str);
	    /* check the data file for information about this thing */
	    if (found > 0 && ans != LOOK_QUICK && ans != LOOK_ONCE &&
			(ans == LOOK_VERBOSE || !quick)) {
		if (found > 1) {
		    n = display_menu(menu.items, menu.icount, "More info?",
				     PICK_ONE, selected);
		    if (n == 1) {
			switch (selected[0]) {
			case 'e': strcpy(firstmatch, descbuf.effectdesc); break;
			case 'i': strcpy(firstmatch, descbuf.invisdesc); break;
			case 'm': strcpy(firstmatch, descbuf.mondesc); break;
			case 'o': strcpy(firstmatch, descbuf.objdesc); break;
			case 't': strcpy(firstmatch, descbuf.trapdesc); break;
			case 'b': strcpy(firstmatch, descbuf.bgdesc); break;
			}
		    }
		} else {
		    n = 1;
		}
		if (n == 1) {
		    /* Fake user_typed_name here when choosing from a menu above
		     * so players get feedback for missing database entries. */
		    checkfile(firstmatch, NULL, found > 1,
			      (ans == LOOK_VERBOSE || found > 1));
		}
	    }
	} else {
	    pline("I've never heard of such things.");
	}

	if (menu.icount)
	    free(menu.items);

	if (quick) check_tutorial_farlook(cc.x, cc.y);
    } while (!quick && ans != LOOK_ONCE);

    flags.verbose = save_verbose;
    if (!quick && flags.verbose)
	pline("Done.");

    return 0;
}